

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O2

StridedValueAccess<64> * __thiscall
rsg::StridedValueAccess<64>::operator=(StridedValueAccess<64> *this,StridedValueRead<64> *valueRead)

{
  int iVar1;
  
  iVar1 = VariableType::getScalarSize((this->super_ConstStridedValueAccess<64>).m_type);
  if ((iVar1 != 0) && (iVar1 << 6 != 0)) {
    memmove((this->super_ConstStridedValueAccess<64>).m_value,valueRead->m_value,
            (long)(iVar1 << 6) << 2);
  }
  return this;
}

Assistant:

StridedValueAccess<Stride>& StridedValueAccess<Stride>::operator= (const StridedValueRead<SrcStride>& valueRead)
{
	DE_STATIC_ASSERT(SrcStride == Stride || SrcStride == 1);
	DE_ASSERT(this->getType() == valueRead.getType());

	int scalarSize = this->getType().getScalarSize();

	if (scalarSize == 0)
		return *this; // Happens when void value range is copied

	if (Stride == SrcStride)
		std::copy(valueRead.getValuePtr(), valueRead.getValuePtr() + scalarSize*Stride, this->m_value);
	else
	{
		for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
			std::fill(this->m_value + scalarNdx*Stride, this->m_value + (scalarNdx+1)*Stride, valueRead.getValuePtr()[scalarNdx]);
	}

	return *this;
}